

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O2

void cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *this;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmExecutionStatus status;
  string local_2b0;
  char *accessString;
  char *currentListFile;
  string stack;
  ostringstream error;
  undefined4 uStack_25c;
  cmListFileFunction newLFF;
  cmListFileArgument arg;
  
  if (*client_data != '\0') {
    return;
  }
  *(undefined1 *)client_data = 1;
  newLFF.super_cmCommandContext.Name.Lower._M_dataplus._M_p =
       (pointer)&newLFF.super_cmCommandContext.Name.Lower.field_2;
  newLFF.super_cmCommandContext.Name.Lower._M_string_length = 0;
  newLFF.super_cmCommandContext.Name.Lower.field_2._M_local_buf[0] = '\0';
  newLFF.super_cmCommandContext.Name.Original._M_dataplus._M_p =
       (pointer)&newLFF.super_cmCommandContext.Name.Original.field_2;
  newLFF.super_cmCommandContext.Name.Original._M_string_length = 0;
  newLFF.super_cmCommandContext.Name.Original.field_2._M_local_buf[0] = '\0';
  newLFF.super_cmCommandContext.Line = 0;
  newLFF.super_cmCommandContext.Col = 0;
  newLFF.super_cmCommandContext.EndLine = 0;
  newLFF.super_cmCommandContext.EndCol = 0;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  newLFF.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arg.Value._M_dataplus._M_p = (pointer)&arg.Value.field_2;
  arg.Value._M_string_length = 0;
  arg.Value.field_2._M_local_buf[0] = '\0';
  arg.Delim = Unquoted;
  arg.Line = 0;
  arg.Col._0_4_ = 0xffffffff;
  arg.Col._4_4_ = 0xffffffff;
  arg.LineEnd._0_4_ = 0xffffffff;
  arg.LineEnd._4_4_ = 0xffffffff;
  arg.ColEnd = -1;
  accessString = cmVariableWatch::GetAccessAsString(access_type);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"CMAKE_CURRENT_LIST_FILE",(allocator<char> *)&stack);
  pcVar2 = cmMakefile::GetDefinition(mf,(string *)&error);
  std::__cxx11::string::~string((string *)&error);
  currentListFile = pcVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"LISTFILE_STACK",(allocator<char> *)&local_2b0);
  pcVar2 = cmMakefile::GetProperty(mf,(string *)&error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack,pcVar2,(allocator<char> *)&status);
  std::__cxx11::string::~string((string *)&error);
  if (*(long *)((long)client_data + 0x10) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
    poVar3 = std::operator<<((ostream *)&error,"Variable \"");
    poVar3 = std::operator<<(poVar3,(string *)variable);
    poVar3 = std::operator<<(poVar3,"\" was accessed using ");
    poVar3 = std::operator<<(poVar3,accessString);
    poVar3 = std::operator<<(poVar3," with value \"");
    pcVar2 = "";
    if (newValue != (char *)0x0) {
      pcVar2 = newValue;
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3,"\".");
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(mf,LOG,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  }
  else {
    this = &newLFF.Arguments;
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::clear(this);
    _error = 1;
    local_2b0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string_const&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,variable,
               (Delimiter *)&error,(int *)&local_2b0);
    _error = 1;
    local_2b0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,&accessString,
               (Delimiter *)&error,(int *)&local_2b0);
    _error = "";
    if (newValue != (char *)0x0) {
      _error = newValue;
    }
    local_2b0._M_dataplus._M_p._0_4_ = 1;
    status.ReturnInvoked = true;
    status.BreakInvoked = true;
    status.ContinueInvoked = false;
    status.NestedError = false;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,(char **)&error
               ,(Delimiter *)&local_2b0,(int *)&status);
    _error = 1;
    local_2b0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<char_const*&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,
               &currentListFile,(Delimiter *)&error,(int *)&local_2b0);
    _error = 1;
    local_2b0._M_dataplus._M_p._0_4_ = 9999;
    std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
    emplace_back<std::__cxx11::string&,cmListFileArgument::Delimiter,int>
              ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)this,&stack,
               (Delimiter *)&error,(int *)&local_2b0);
    cmCommandContext::cmCommandName::operator=
              ((cmCommandName *)&newLFF,(string *)((long)client_data + 8));
    newLFF.super_cmCommandContext.Line = 9999;
    status.ReturnInvoked = false;
    status.BreakInvoked = false;
    status.ContinueInvoked = false;
    status.NestedError = false;
    bVar1 = cmMakefile::ExecuteCommand(mf,&newLFF,&status);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
      poVar3 = std::operator<<((ostream *)&error,"Error in cmake code at\nUnknown:0:\n");
      poVar3 = std::operator<<(poVar3,"A command failed during the invocation of callback \"");
      poVar3 = std::operator<<(poVar3,(string *)((long)client_data + 8));
      std::operator<<(poVar3,"\".");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      *(undefined1 *)client_data = 0;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
      goto LAB_0028fea4;
    }
  }
  *(undefined1 *)client_data = 0;
LAB_0028fea4:
  std::__cxx11::string::~string((string *)&stack);
  std::__cxx11::string::~string((string *)&arg);
  cmListFileFunction::~cmListFileFunction(&newLFF);
  return;
}

Assistant:

static void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                                   int access_type,
                                                   void* client_data,
                                                   const char* newValue,
                                                   const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  cmListFileFunction newLFF;
  cmListFileArgument arg;
  bool processed = false;
  const char* accessString = cmVariableWatch::GetAccessAsString(access_type);
  const char* currentListFile = mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = makefile->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    newLFF.Arguments.clear();
    newLFF.Arguments.emplace_back(variable, cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(accessString, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(newValue ? newValue : "",
                                  cmListFileArgument::Quoted, 9999);
    newLFF.Arguments.emplace_back(currentListFile, cmListFileArgument::Quoted,
                                  9999);
    newLFF.Arguments.emplace_back(stack, cmListFileArgument::Quoted, 9999);
    newLFF.Name = data->Command;
    newLFF.Line = 9999;
    cmExecutionStatus status;
    if (!makefile->ExecuteCommand(newLFF, status)) {
      std::ostringstream error;
      error << "Error in cmake code at\nUnknown:0:\n"
            << "A command failed during the invocation of callback \""
            << data->Command << "\".";
      cmSystemTools::Error(error.str());
      data->InCallback = false;
      return;
    }
    processed = true;
  }
  if (!processed) {
    std::ostringstream msg;
    msg << "Variable \"" << variable << "\" was accessed using "
        << accessString << " with value \"" << (newValue ? newValue : "")
        << "\".";
    makefile->IssueMessage(MessageType::LOG, msg.str());
  }

  data->InCallback = false;
}